

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.cpp
# Opt level: O0

void __thiscall Buffer::SaveDataAll(Buffer *this)

{
  bool bVar1;
  reference piVar2;
  _Self local_28;
  _List_node_base *local_20;
  _List_iterator<int> local_18;
  iterator it;
  Buffer *this_local;
  
  it._M_node = (_List_node_base *)this;
  std::_List_iterator<int>::_List_iterator(&local_18);
  local_20 = (_List_node_base *)
             std::__cxx11::list<int,_std::allocator<int>_>::begin(&this->Occupy_Block);
  local_18._M_node = local_20;
  while( true ) {
    local_28._M_node =
         (_List_node_base *)std::__cxx11::list<int,_std::allocator<int>_>::end(&this->Occupy_Block);
    bVar1 = std::operator!=(&local_18,&local_28);
    if (!bVar1) break;
    piVar2 = std::_List_iterator<int>::operator*(&local_18);
    SaveData(this,*piVar2);
    std::_List_iterator<int>::operator++(&local_18,0);
  }
  return;
}

Assistant:

void Buffer::SaveDataAll(void) {
	list<int>::iterator it;
	for (it = this->Occupy_Block.begin(); it != this->Occupy_Block.end(); it++) {
		this->SaveData(*it);
	}
}